

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O2

Emitter * __thiscall YAML::Emitter::Write(Emitter *this,Binary *binary)

{
  allocator local_81;
  string local_80;
  _Tag local_60;
  
  std::__cxx11::string::string((string *)&local_80,"binary",&local_81);
  SecondaryTag(&local_60,&local_80);
  Write(this,&local_60);
  _Tag::~_Tag(&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  if (((this->m_pState)._M_t.
       super___uniq_ptr_impl<YAML::EmitterState,_std::default_delete<YAML::EmitterState>_>._M_t.
       super__Tuple_impl<0UL,_YAML::EmitterState_*,_std::default_delete<YAML::EmitterState>_>.
       super__Head_base<0UL,_YAML::EmitterState_*,_false>._M_head_impl)->m_isGood != false) {
    PrepareNode(this,Scalar);
    Utils::WriteBinary(&this->m_stream,binary);
    StartedScalar(this);
  }
  return this;
}

Assistant:

Emitter& Emitter::Write(const Binary& binary) {
  Write(SecondaryTag("binary"));

  if (!good())
    return *this;

  PrepareNode(EmitterNodeType::Scalar);
  Utils::WriteBinary(m_stream, binary);
  StartedScalar();

  return *this;
}